

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O3

void __thiscall json11::Statics::Statics(Statics *this)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001af650;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR_type_001af6c8;
  (this->null).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  (this->null).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001af778;
  *(undefined1 *)&p_Var2[1]._M_use_count = 1;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR_type_001af7c8;
  (this->t).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  (this->t).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001af778;
  *(undefined1 *)&p_Var2[1]._M_use_count = 0;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR_type_001af7c8;
  (this->f).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  (this->f).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  (this->empty_string)._M_dataplus._M_p = (pointer)&(this->empty_string).field_2;
  (this->empty_string)._M_string_length = 0;
  (this->empty_string).field_2._M_local_buf[0] = '\0';
  (this->empty_vector).super__Vector_base<json11::Json,_std::allocator<json11::Json>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->empty_vector).super__Vector_base<json11::Json,_std::allocator<json11::Json>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->empty_vector).super__Vector_base<json11::Json,_std::allocator<json11::Json>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->empty_map)._M_t._M_impl.super__Rb_tree_header;
  (this->empty_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->empty_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->empty_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->empty_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->empty_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Statics() {}